

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

BitWidth __thiscall
flexbuffers::Builder::Value::ElemWidth(Value *this,size_t buf_size,size_t elem_index)

{
  bool bVar1;
  BitWidth BVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (this->type_ == FBT_BOOL || (int)this->type_ < 4) {
    BVar2 = this->min_bit_width_;
  }
  else {
    uVar3 = 1;
    while( true ) {
      uVar4 = ((uVar3 - 1 & -buf_size) + buf_size + uVar3 * elem_index) - (this->field_0).i_;
      BVar2 = BIT_WIDTH_8;
      if ((0xff < uVar4) && (BVar2 = BIT_WIDTH_16, 0xffff < uVar4)) {
        BVar2 = BIT_WIDTH_64 - (uVar4 >> 0x20 == 0);
      }
      if (1L << ((byte)BVar2 & 0x3f) == uVar3) break;
      bVar1 = 4 < uVar3;
      uVar3 = uVar3 * 2;
      if (bVar1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                      ,0x60d,"BitWidth flexbuffers::Builder::Value::ElemWidth(size_t, size_t) const"
                     );
      }
    }
  }
  return BVar2;
}

Assistant:

BitWidth ElemWidth(size_t buf_size, size_t elem_index) const {
      if (IsInline(type_)) {
        return min_bit_width_;
      } else {
        // We have an absolute offset, but want to store a relative offset
        // elem_index elements beyond the current buffer end. Since whether
        // the relative offset fits in a certain byte_width depends on
        // the size of the elements before it (and their alignment), we have
        // to test for each size in turn.
        for (size_t byte_width = 1;
             byte_width <= sizeof(flatbuffers::largest_scalar_t);
             byte_width *= 2) {
          // Where are we going to write this offset?
          auto offset_loc = buf_size +
                            flatbuffers::PaddingBytes(buf_size, byte_width) +
                            elem_index * byte_width;
          // Compute relative offset.
          auto offset = offset_loc - u_;
          // Does it fit?
          auto bit_width = WidthU(offset);
          if (static_cast<size_t>(static_cast<size_t>(1U) << bit_width) ==
              byte_width)
            return bit_width;
        }
        FLATBUFFERS_ASSERT(false);  // Must match one of the sizes above.
        return BIT_WIDTH_64;
      }
    }